

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLex.cpp
# Opt level: O0

void __thiscall UnitTest_lex2::UnitTest_lex2(UnitTest_lex2 *this)

{
  undefined8 *in_RDI;
  UnitTestBase *unaff_retaddr;
  
  UnitTestBase::UnitTestBase(unaff_retaddr);
  *in_RDI = &PTR_Run_002686c0;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"lex2");
  return;
}

Assistant:

TEST_CASE(lex2)
{
    LexerWrapper lexer("-- this is comment\n"
                       "--[[this is long\n comment]]"
                       "--[[this is long\n comment too--]]"
                       "--[[incomplete comment]");

    EXPECT_EXCEPTION(luna::LexException, {
        lexer.GetToken();
    });
}